

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O2

int av1_check_show_filtered_frame
              (YV12_BUFFER_CONFIG *frame,FRAME_DIFF *frame_diff,int q_index,
              aom_bit_depth_t bit_depth)

{
  int16_t iVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  
  iVar2 = (((frame->field_2).field_0.y_crop_width + 0x1f) / 0x20) *
          (((frame->field_3).field_0.y_crop_height + 0x1f) / 0x20);
  iVar3 = 1;
  if (iVar2 < 2) {
    iVar2 = iVar3;
  }
  fVar5 = (float)frame_diff->sum / (float)iVar2;
  fVar4 = (float)frame_diff->sse / (float)iVar2 - fVar5 * fVar5;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  iVar1 = av1_ac_quant_QTX(q_index,0,bit_depth);
  if (((float)(int)iVar1 * 0.7 * (float)(int)iVar1 <= fVar5) || (fVar5 * 1.2 <= fVar4)) {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int av1_check_show_filtered_frame(const YV12_BUFFER_CONFIG *frame,
                                  const FRAME_DIFF *frame_diff, int q_index,
                                  aom_bit_depth_t bit_depth) {
  const int frame_height = frame->y_crop_height;
  const int frame_width = frame->y_crop_width;
  const int block_height = block_size_high[TF_BLOCK_SIZE];
  const int block_width = block_size_wide[TF_BLOCK_SIZE];
  const int mb_rows = get_num_blocks(frame_height, block_height);
  const int mb_cols = get_num_blocks(frame_width, block_width);
  const int num_mbs = AOMMAX(1, mb_rows * mb_cols);
  const float mean = (float)frame_diff->sum / num_mbs;
  const float std = (float)sqrt((float)frame_diff->sse / num_mbs - mean * mean);

  const int ac_q_step = av1_ac_quant_QTX(q_index, 0, bit_depth);
  const float threshold = 0.7f * ac_q_step * ac_q_step;

  if (mean < threshold && std < mean * 1.2) {
    return 1;
  }
  return 0;
}